

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,QByteArray *array)

{
  QTextStreamPrivate *pQVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  storage_type_conflict *psVar5;
  long in_FS_OFFSET;
  QStringView string;
  qsizetype length;
  QChar *ptr;
  QByteArray local_58;
  QtPrivate *local_38;
  QChar *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    operator>>(this);
  }
  else {
    QTextStreamPrivate::scan(pQVar1,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
    QTextStreamPrivate::consumeLastToken(pQVar1);
    local_30 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = (QtPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    psVar5 = (storage_type_conflict *)0x0;
    bVar4 = QTextStreamPrivate::scan(pQVar1,&local_30,(qsizetype *)&local_38,0,Space);
    if (bVar4) {
      string.m_data = psVar5;
      string.m_size = (qsizetype)local_30;
      QtPrivate::convertToUtf8(&local_58,local_38,string);
      data = &((array->d).d)->super_QArrayData;
      pcVar2 = (array->d).ptr;
      (array->d).d = local_58.d.d;
      (array->d).ptr = local_58.d.ptr;
      qVar3 = (array->d).size;
      (array->d).size = local_58.d.size;
      local_58.d.d = (Data *)data;
      local_58.d.ptr = pcVar2;
      local_58.d.size = qVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
      QTextStreamPrivate::consumeLastToken(pQVar1);
    }
    else {
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadPastEnd;
      }
      QByteArray::clear(array);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(QByteArray &array)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);

    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        array.clear();
        return *this;
    }

    array = QStringView(ptr, length).toUtf8();

    d->consumeLastToken();
    return *this;
}